

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkShaderModule module,VkShaderModule *out_module)

{
  bool bVar1;
  const_iterator cVar2;
  long *in_FS_OFFSET;
  VkShaderModule module_local;
  
  module_local = module;
  cVar2 = std::
          _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->shader_module_to_hash)._M_h,&module_local);
  if (cVar2.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
      bVar1 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "Cannot find shader module in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                        );
      if (!bVar1) {
        fwrite("Fossilize WARN: Cannot find shader module in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               ,0x81,1,_stderr);
      }
    }
  }
  else {
    *out_module = *(VkShaderModule *)
                   ((long)cVar2.
                          super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>
                          ._M_cur + 0x10);
  }
  return cVar2.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkShaderModule module, VkShaderModule *out_module) const
{
	auto itr = shader_module_to_hash.find(module);
	if (itr == end(shader_module_to_hash))
	{
		LOGW_LEVEL("Cannot find shader module in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_module = api_object_cast<VkShaderModule>(uint64_t(itr->second));
		return true;
	}
}